

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimPatValuesDerive(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,Vec_Wrd_t *vValues)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  word *__dest;
  word *__src;
  bool bVar3;
  int local_30;
  int local_2c;
  int Id;
  int i;
  Vec_Wrd_t *vValues_local;
  Vec_Wrd_t *vSims_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(vSims);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != nWords * iVar2) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x91,"void Gia_ManSimPatValuesDerive(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  iVar1 = Vec_WrdSize(vValues);
  iVar2 = Gia_ManCoNum(p);
  if (iVar1 == nWords * iVar2) {
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar3 = false;
      if (local_2c < iVar1) {
        pObj = Gia_ManCo(p,local_2c);
        local_30 = Gia_ObjId(p,pObj);
        bVar3 = local_30 != 0;
      }
      if (!bVar3) break;
      __dest = Vec_WrdEntryP(vValues,nWords * local_2c);
      __src = Vec_WrdEntryP(vSims,nWords * local_30);
      memcpy(__dest,__src,(long)nWords << 3);
      local_2c = local_2c + 1;
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vValues) == nWords * Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x92,"void Gia_ManSimPatValuesDerive(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)");
}

Assistant:

void Gia_ManSimPatValuesDerive( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, Vec_Wrd_t * vValues )
{
    int i, Id;
    assert( Vec_WrdSize(vSims)   == nWords * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vValues) == nWords * Gia_ManCoNum(p)  );
    Gia_ManForEachCoId( p, Id, i )
        memcpy( Vec_WrdEntryP(vValues, nWords * i), Vec_WrdEntryP(vSims, nWords * Id), sizeof(word)* nWords );
}